

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi.cpp
# Opt level: O0

void __thiscall curlpp::Multi::add(Multi *this,Easy *handle)

{
  int iVar1;
  CURL *pCVar2;
  undefined8 uVar3;
  map<void_*,_const_curlpp::Easy_*,_std::less<void_*>,_std::allocator<std::pair<void_*const,_const_curlpp::Easy_*>_>_>
  *in_RDI;
  CURLMcode code;
  _Rb_tree_header *__y;
  void **in_stack_ffffffffffffff90;
  pair<void_*,_const_curlpp::Easy_*> *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffd8;
  RuntimeError *in_stack_ffffffffffffffe0;
  
  uVar3 = *(undefined8 *)&(in_RDI->_M_t)._M_impl;
  pCVar2 = Easy::getHandle((Easy *)0x148f7a);
  iVar1 = curl_multi_add_handle(uVar3,pCVar2);
  if ((iVar1 != -1) && (iVar1 != 0)) {
    uVar3 = __cxa_allocate_exception(0x10);
    curl_multi_strerror(iVar1);
    RuntimeError::RuntimeError(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    __cxa_throw(uVar3,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  __y = &(in_RDI->_M_t)._M_impl.super__Rb_tree_header;
  Easy::getHandle((Easy *)0x149014);
  std::make_pair<void*,curlpp::Easy_const*&>(in_stack_ffffffffffffff90,(Easy **)__y);
  std::
  map<void*,curlpp::Easy_const*,std::less<void*>,std::allocator<std::pair<void*const,curlpp::Easy_const*>>>
  ::insert<std::pair<void*,curlpp::Easy_const*>>(in_RDI,in_stack_ffffffffffffff98);
  return;
}

Assistant:

void
curlpp::Multi::add(const curlpp::Easy * handle)
{
  CURLMcode code = curl_multi_add_handle(mMultiHandle, handle->getHandle());
  if(code != CURLM_CALL_MULTI_PERFORM) {
    if(code != CURLM_OK) {
      throw curlpp::RuntimeError(curl_multi_strerror(code));
    }
  }
  mHandles.insert(std::make_pair(handle->getHandle(),handle));
}